

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall
capnp::compiler::Compiler::Node::traverseBrand
          (Node *this,Reader *brand,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  uint *puVar1;
  bool bVar2;
  Which WVar3;
  Which WVar4;
  Iterator IVar5;
  Iterator IVar6;
  Reader local_1b8;
  undefined1 local_188 [8];
  Reader binding;
  undefined1 local_148 [8];
  Iterator __end4;
  undefined1 local_128 [8];
  Iterator __begin4;
  Reader *__range4;
  Reader scope;
  undefined1 local_a0 [8];
  Iterator __end2;
  undefined1 local_80 [8];
  Iterator __begin2;
  Reader *__range2;
  Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo_local;
  SchemaLoader *finalLoader_local;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  *seen_local;
  uint eagerness_local;
  Reader *brand_local;
  Node *this_local;
  
  puVar1 = &__begin2.index;
  capnp::schema::Brand::Reader::getScopes((Reader *)puVar1,brand);
  IVar5 = List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader::begin((Reader *)puVar1);
  __end2._8_8_ = IVar5.container;
  __begin2.container._0_4_ = IVar5.index;
  local_80 = (undefined1  [8])__end2._8_8_;
  IVar5 = List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader::end((Reader *)puVar1);
  scope._reader._40_8_ = IVar5.container;
  __end2.container._0_4_ = IVar5.index;
  local_a0 = (undefined1  [8])scope._reader._40_8_;
  while (bVar2 = capnp::_::
                 IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                 ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                               *)local_80,
                              (IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                               *)local_a0), bVar2) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
    ::operator*((Reader *)&__range4,
                (IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                 *)local_80);
    WVar3 = capnp::schema::Brand::Scope::Reader::which((Reader *)&__range4);
    if (WVar3 == BIND) {
      puVar1 = &__begin4.index;
      capnp::schema::Brand::Scope::Reader::getBind((Reader *)puVar1,(Reader *)&__range4);
      IVar6 = List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader::begin((Reader *)puVar1);
      __end4._8_8_ = IVar6.container;
      __begin4.container._0_4_ = IVar6.index;
      local_128 = (undefined1  [8])__end4._8_8_;
      IVar6 = List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader::end((Reader *)puVar1);
      binding._reader._40_8_ = IVar6.container;
      __end4.container._0_4_ = IVar6.index;
      local_148 = (undefined1  [8])binding._reader._40_8_;
      while (bVar2 = capnp::_::
                     IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                     ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                                   *)local_128,
                                  (IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                                   *)local_148), bVar2) {
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
        ::operator*((Reader *)local_188,
                    (IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                     *)local_128);
        WVar4 = capnp::schema::Brand::Binding::Reader::which((Reader *)local_188);
        if ((WVar4 != UNBOUND) && (WVar4 == TYPE)) {
          capnp::schema::Brand::Binding::Reader::getType(&local_1b8,(Reader *)local_188);
          traverseType(this,&local_1b8,eagerness,seen,finalLoader,sourceInfo);
        }
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
        ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Binding::Reader>
                      *)local_128);
      }
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                  *)local_80);
  }
  return;
}

Assistant:

void Compiler::Node::traverseBrand(
    const schema::Brand::Reader& brand, uint eagerness,
    std::unordered_map<Node*, uint>& seen,
    const SchemaLoader& finalLoader,
    kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  for (auto scope: brand.getScopes()) {
    switch (scope.which()) {
      case schema::Brand::Scope::BIND:
        for (auto binding: scope.getBind()) {
          switch (binding.which()) {
            case schema::Brand::Binding::UNBOUND:
              break;
            case schema::Brand::Binding::TYPE:
              traverseType(binding.getType(), eagerness, seen, finalLoader, sourceInfo);
              break;
          }
        }
        break;
      case schema::Brand::Scope::INHERIT:
        break;
    }
  }
}